

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O0

void __thiscall DatalogDatabase::smartEvalRules(DatalogDatabase *this,ostream *out)

{
  int iVar1;
  Rule *first;
  size_t sVar2;
  bool bVar3;
  size_type sVar4;
  reference ppRVar5;
  ostream *poVar6;
  reference pvVar7;
  reference pvVar8;
  void *this_00;
  vector<int,_std::allocator<int>_> local_180;
  ulong local_168;
  size_t i_1;
  size_t csize;
  size_t c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  comps;
  undefined1 local_120 [40];
  vector<int,_std::allocator<int>_> pnums;
  undefined1 local_c8 [8];
  graph rg;
  int local_60;
  int local_5c;
  int j;
  int i;
  graph depend_graph;
  int nrules;
  ostream *out_local;
  DatalogDatabase *this_local;
  
  sVar4 = std::vector<Rule_*,_std::allocator<Rule_*>_>::size(&this->rules);
  depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar4;
  graph::graph((graph *)&j,
               depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_);
  for (local_5c = 0;
      local_5c <
      depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_5c = local_5c + 1) {
    for (local_60 = 0;
        local_60 <
        depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; local_60 = local_60 + 1) {
      ppRVar5 = std::vector<Rule_*,_std::allocator<Rule_*>_>::operator[]
                          (&this->rules,(long)local_5c);
      first = *ppRVar5;
      ppRVar5 = std::vector<Rule_*,_std::allocator<Rule_*>_>::operator[]
                          (&this->rules,(long)local_60);
      bVar3 = isRuleDependant(first,*ppRVar5);
      if (bVar3) {
        graph::add_edge((graph *)&j,local_5c,local_60);
      }
    }
  }
  poVar6 = std::operator<<(out,"Dependency Graph");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  graph::toString_abi_cxx11_
            ((graph *)&rg.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  poVar6 = std::operator<<(out,(string *)
                               &rg.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string
            ((string *)
             &rg.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar6 = std::operator<<(out,"Reverse Graph");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  graph::reverse((graph *)local_c8,(graph *)&j);
  graph::toString_abi_cxx11_
            ((graph *)&pnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  poVar6 = std::operator<<(out,(string *)
                               &pnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string
            ((string *)
             &pnums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  graph::DFSForest((vector<int,_std::allocator<int>_> *)(local_120 + 0x20),(graph *)local_c8);
  poVar6 = std::operator<<(out,"Postorder Numbers");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  graph::pos_nums_abi_cxx11_((graph *)local_120);
  poVar6 = std::operator<<(out,(string *)local_120);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_120);
  poVar6 = std::operator<<(out,"SCC Search Order");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  iVar1 = depend_graph.temp_node_arr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &comps.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)(local_120 + 0x20));
  print_rules(iVar1,(vector<int,_std::allocator<int>_> *)
                    &comps.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,out);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &comps.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  graph::SCC((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)&c,(graph *)&j);
  csize = 0;
  do {
    sVar2 = csize;
    sVar4 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&c);
    if (sVar4 <= sVar2) {
      poVar6 = std::operator<<(out,"Rule Evaluation Complete");
      this_00 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&c);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)(local_120 + 0x20));
      graph::~graph((graph *)local_c8);
      graph::~graph((graph *)&j);
      return;
    }
    std::operator<<(out,"SCC:");
    pvVar7 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&c,csize);
    i_1 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
    for (local_168 = 0; local_168 < i_1; local_168 = local_168 + 1) {
      poVar6 = std::operator<<(out," R");
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&c,csize);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,local_168);
      std::ostream::operator<<(poVar6,*pvVar8);
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    if (i_1 == 1) {
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&c,csize);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,0);
      iVar1 = *pvVar8;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&c,csize);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,0);
      bVar3 = graph::has_edge((graph *)&j,iVar1,*pvVar8);
      if (bVar3) goto LAB_0013b7e1;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&c,csize);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,0);
      ppRVar5 = std::vector<Rule_*,_std::allocator<Rule_*>_>::operator[](&this->rules,(long)*pvVar8)
      ;
      evaluateRule(this,*ppRVar5,out);
      std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
    }
    else {
LAB_0013b7e1:
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&c,csize);
      std::vector<int,_std::allocator<int>_>::vector(&local_180,pvVar7);
      fixed_point(this,&local_180,out);
      std::vector<int,_std::allocator<int>_>::~vector(&local_180);
    }
    csize = csize + 1;
  } while( true );
}

Assistant:

void DatalogDatabase::smartEvalRules(ostream& out)
{
  int nrules = rules.size();
  graph depend_graph = graph(nrules);
  for (int i=0; i < nrules; i++)
  {
    for (int j = 0; j < nrules; j++)
    {
      //check if rule i depends on j
      if (isRuleDependant(rules[i], rules[j])) depend_graph.add_edge(i, j);
    }

  }

  //ouput dependancy graph
  out << "Dependency Graph" << endl;
  out << depend_graph.toString() << endl;
  out << "Reverse Graph" << endl;
  graph rg = depend_graph.reverse();
  out << rg.toString() << endl;
  vector<int> pnums = rg.DFSForest();
  out << "Postorder Numbers"  << endl;
  out << rg.pos_nums() << endl;
  out << "SCC Search Order" << endl;
  print_rules(nrules, pnums, out);
  out<<endl;

  vector<vector<int>> comps = depend_graph.SCC();
  for (size_t c= 0; c < comps.size(); c++)
  {
    out << "SCC:";
    size_t csize = comps[c].size();
    for (size_t i = 0; i < csize; i++)
    {
      out << " R" << comps[c][i];
    }
    out << endl;
    if (csize == 1 && !depend_graph.has_edge(comps[c][0], comps[c][0]))
    {
      evaluateRule(rules[comps[c][0]], out);
      out << endl;
      continue;
    }
    fixed_point(comps[c], out);
  }
  out << "Rule Evaluation Complete" << endl << endl;
}